

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:569:57)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:569:57)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *pvVar1;
  undefined8 *puVar2;
  value *pvVar3;
  long *plVar4;
  uint32_t index;
  uint32_t index_00;
  anon_class_16_1_570cf4e1_for_f *this_00;
  uint uVar5;
  mjs *this_01;
  double dVar6;
  double dVar7;
  object_ptr res;
  uint local_108;
  uint local_100;
  gc_heap_ptr_untyped local_f8;
  wstring local_e8;
  wstring local_c8;
  value *local_a8;
  gc_heap *local_a0;
  size_type local_98;
  pointer local_90;
  wstring_view local_88;
  gc_heap_ptr_untyped local_78;
  value local_68;
  
  this_00 = &this->f;
  local_a8 = __return_storage_ptr__;
  pvVar1 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  if (this_->type_ != object) {
    __assert_fail("type_ == value_type::object",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                  0x46,"const object_ptr &mjs::value::object_value() const");
  }
  puVar2 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(this_->field_1).s_);
  local_e8._M_dataplus._M_p = (pointer)0x6;
  local_e8._M_string_length = 0x198a18;
  (**(code **)*puVar2)(&local_68,puVar2);
  local_108 = to_uint32(&local_68);
  value::destroy(&local_68);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pvVar3 == pvVar1) {
    local_100 = 0;
  }
  else {
    dVar6 = to_integer(pvVar1);
    dVar7 = (double)local_108;
    if (0.0 <= dVar6) {
      if (dVar6 <= dVar7) {
        dVar7 = dVar6;
      }
    }
    else {
      dVar7 = dVar6 + dVar7;
      if (dVar7 <= 0.0) {
        dVar7 = 0.0;
      }
    }
    local_100 = (uint)(long)dVar7;
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar3 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (1 < (ulong)(((long)pvVar3 - (long)pvVar1 >> 3) * -0x3333333333333333)) {
    dVar6 = to_integer(pvVar1 + 1);
    dVar7 = (double)local_108;
    if (0.0 <= dVar6) {
      if (dVar6 <= dVar7) {
        dVar7 = dVar6;
      }
    }
    else {
      dVar7 = dVar6 + dVar7;
      if (dVar7 <= 0.0) {
        dVar7 = 0.0;
      }
    }
    local_108 = (uint)(long)dVar7;
  }
  this_01 = (mjs *)0x0;
  make_array((gc_heap_ptr<mjs::global_object> *)&local_f8,(uint32_t)this_00);
  if (local_100 < local_108) {
    local_a0 = (this_00->global).super_gc_heap_ptr_untyped.heap_;
    do {
      plVar4 = (long *)gc_heap_ptr_untyped::get(&local_f8);
      index_string_abi_cxx11_(&local_e8,this_01,index);
      local_88._M_len = local_e8._M_string_length;
      local_88._M_str = local_e8._M_dataplus._M_p;
      string::string((string *)&local_78,local_a0,&local_88);
      puVar2 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(this_->field_1).s_);
      index_string_abi_cxx11_(&local_c8,(mjs *)(ulong)(local_100 + (int)this_01),index_00);
      local_98 = local_c8._M_string_length;
      local_90 = local_c8._M_dataplus._M_p;
      (**(code **)*puVar2)(&local_68,puVar2,&local_98);
      (**(code **)(*plVar4 + 8))(plVar4,&local_78,&local_68,0);
      value::destroy(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity * 4 + 4);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity * 4 + 4);
      }
      uVar5 = (int)this_01 + 1;
      this_01 = (mjs *)(ulong)uVar5;
    } while (local_108 - local_100 != uVar5);
  }
  pvVar1 = local_a8;
  local_a8->type_ = object;
  (local_a8->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       local_f8.heap_;
  *(uint32_t *)((long)&local_a8->field_1 + 8) = local_f8.pos_;
  if (local_f8.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_f8.heap_,(gc_heap_ptr_untyped *)&(local_a8->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_f8);
  return pvVar1;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }